

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
dnet::data_types::tensor<double,_2U>::tensor
          (tensor<double,_2U> *this,type *data,array<unsigned_int,_2UL> size)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_58;
  output_type local_40;
  _Type local_28;
  type *local_20;
  type *data_local;
  tensor<double,_2U> *this_local;
  array<unsigned_int,_2UL> size_local;
  
  local_28 = size._M_elems;
  local_20 = data;
  data_local = (type *)this;
  this_local = (tensor<double,_2U> *)size._M_elems;
  tensor(this,size);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_58,data);
  vec_flater<double,_2U>::flatten(&local_40,&local_58);
  std::vector<double,_std::allocator<double>_>::operator=(&this->_data,&local_40);
  std::vector<double,_std::allocator<double>_>::~vector(&local_40);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

tensor<T, N>::tensor(typename vector_dim<T, N>::type data, std::array<index_type, N> size)
                : tensor(size)
        {
            this->_data = vec_flater<T, N>::flatten(data);
        }